

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O0

int __thiscall BitDhtHandler::PeerCallback(BitDhtHandler *this,bdId *id,uint32_t status)

{
  bool bVar1;
  pointer ppVar2;
  bool connect;
  iterator iStack_58;
  _Base_ptr local_40;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_BssResult>_> local_38;
  iterator it;
  bdStackMutex stack;
  uint32_t status_local;
  bdId *id_local;
  BitDhtHandler *this_local;
  
  std::operator<<((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() NodeId: ");
  bdStdPrintId((ostream *)&std::cerr,id);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  bdStackMutex::bdStackMutex((bdStackMutex *)&it,&this->resultsMtx);
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_BssResult>_>::_Rb_tree_iterator(&local_38);
  local_40 = (_Base_ptr)
             std::
             map<bdNodeId,_BssResult,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_BssResult>_>_>
             ::find(&this->mSearchNodes,&id->id);
  local_38._M_node = local_40;
  iStack_58 = std::
              map<bdNodeId,_BssResult,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_BssResult>_>_>
              ::end(&this->mSearchNodes);
  bVar1 = std::operator==(&local_38,&stack0xffffffffffffffa8);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() Unknown NodeId !!! ");
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_bdNodeId,_BssResult>_>::operator->(&local_38);
    (ppVar2->second).status = status;
    switch(status) {
    case 1:
      std::operator<<((ostream *)&std::cerr,
                      "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ");
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      break;
    case 2:
      std::operator<<((ostream *)&std::cerr,
                      "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ");
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      break;
    case 3:
      std::operator<<((ostream *)&std::cerr,
                      "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ");
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_bdNodeId,_BssResult>_>::operator->(&local_38);
      memcpy(&ppVar2->second,id,0x24);
      break;
    case 4:
      std::operator<<((ostream *)&std::cerr,
                      "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address");
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_bdNodeId,_BssResult>_>::operator->(&local_38);
      memcpy(&ppVar2->second,id,0x24);
    }
  }
  bdStackMutex::~bdStackMutex((bdStackMutex *)&it);
  return 1;
}

Assistant:

int BitDhtHandler::PeerCallback(const bdId *id, uint32_t status) {
	std::cerr << "BitDhtHandler::PeerCallback() NodeId: ";
	bdStdPrintId(std::cerr, id);
	std::cerr << std::endl;

    bdStackMutex stack(resultsMtx); /********** MUTEX LOCKED *************/

	/* find the node from our list */
	std::map<bdNodeId, BssResult>::iterator it;
	it = mSearchNodes.find(id->id);
	if (it == mSearchNodes.end()) {
		std::cerr << "BitDhtHandler::PeerCallback() Unknown NodeId !!! ";
		std::cerr << std::endl;
		return 1;
	}
	it->second.status = status;

	bool connect = false;
	switch(status) {
        case BITDHT_MGR_QUERY_FAILURE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_OFFLINE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_UNREACHABLE: {
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
        case BITDHT_MGR_QUERY_PEER_ONLINE: {
            /* do something */

            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
	}
	return 1;
}